

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_copy_to_file.cpp
# Opt level: O0

unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true> __thiscall
duckdb::PhysicalCopyToFile::GetLocalSinkState(PhysicalCopyToFile *this,ExecutionContext *context)

{
  _Head_base<0UL,_duckdb::LocalFunctionData_*,_false> _Var1;
  PhysicalCopyToFile *op;
  type pFVar2;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *in_RDX;
  unique_ptr<duckdb::LocalFunctionData,_std::default_delete<duckdb::LocalFunctionData>,_true>
  *in_RSI;
  _Head_base<0UL,_duckdb::LocalSinkState_*,_false> in_RDI;
  templated_unique_single_t res;
  templated_unique_single_t state;
  CopyToFunctionGlobalState *g;
  unique_ptr<duckdb::CopyToFunctionLocalState,_std::default_delete<duckdb::CopyToFunctionLocalState>_>
  *in_stack_ffffffffffffff68;
  GlobalSinkState *in_stack_ffffffffffffff70;
  CopyToFunctionGlobalState *gstate;
  _Head_base<0UL,_duckdb::LocalSinkState_*,_false> this_00;
  undefined1 local_50 [32];
  undefined8 local_30;
  undefined1 local_28 [40];
  
  if ((*(byte *)((long)&in_RSI[0x78].
                        super_unique_ptr<duckdb::LocalFunctionData,_std::default_delete<duckdb::LocalFunctionData>_>
                        ._M_t.
                        super___uniq_ptr_impl<duckdb::LocalFunctionData,_std::default_delete<duckdb::LocalFunctionData>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::LocalFunctionData_*,_std::default_delete<duckdb::LocalFunctionData>_>
                        .super__Head_base<0UL,_duckdb::LocalFunctionData_*,_false>._M_head_impl + 2)
      & 1) == 0) {
    _Var1._M_head_impl =
         in_RSI[0x1c].
         super_unique_ptr<duckdb::LocalFunctionData,_std::default_delete<duckdb::LocalFunctionData>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::LocalFunctionData,_std::default_delete<duckdb::LocalFunctionData>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LocalFunctionData_*,_std::default_delete<duckdb::LocalFunctionData>_>
         .super__Head_base<0UL,_duckdb::LocalFunctionData_*,_false>._M_head_impl;
    pFVar2 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
             operator*(in_RDX);
    (*(code *)_Var1._M_head_impl)(local_50,in_RDX,pFVar2);
    make_uniq<duckdb::CopyToFunctionLocalState,duckdb::unique_ptr<duckdb::LocalFunctionData,std::default_delete<duckdb::LocalFunctionData>,true>>
              (in_RSI);
    unique_ptr<duckdb::LocalFunctionData,_std::default_delete<duckdb::LocalFunctionData>,_true>::
    ~unique_ptr((unique_ptr<duckdb::LocalFunctionData,_std::default_delete<duckdb::LocalFunctionData>,_true>
                 *)0x1866709);
    unique_ptr<duckdb::LocalSinkState,std::default_delete<duckdb::LocalSinkState>,true>::
    unique_ptr<duckdb::CopyToFunctionLocalState,std::default_delete<std::unique_ptr<duckdb::LocalSinkState,std::default_delete<duckdb::LocalSinkState>>>,void>
              ((unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>
                *)in_RDX,in_stack_ffffffffffffff68);
    unique_ptr<duckdb::CopyToFunctionLocalState,_std::default_delete<duckdb::CopyToFunctionLocalState>,_true>
    ::~unique_ptr((unique_ptr<duckdb::CopyToFunctionLocalState,_std::default_delete<duckdb::CopyToFunctionLocalState>,_true>
                   *)0x1866722);
  }
  else {
    this_00._M_head_impl = in_RDI._M_head_impl;
    unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
    operator->((unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                *)in_stack_ffffffffffffff70);
    local_28._8_8_ =
         GlobalSinkState::Cast<duckdb::CopyToFunctionGlobalState>(in_stack_ffffffffffffff70);
    local_30 = 0;
    gstate = (CopyToFunctionGlobalState *)local_28;
    make_uniq<duckdb::CopyToFunctionLocalState,decltype(nullptr)>((void **)in_RSI);
    op = (PhysicalCopyToFile *)
         unique_ptr<duckdb::CopyToFunctionLocalState,_std::default_delete<duckdb::CopyToFunctionLocalState>,_true>
         ::operator->((unique_ptr<duckdb::CopyToFunctionLocalState,_std::default_delete<duckdb::CopyToFunctionLocalState>,_true>
                       *)in_stack_ffffffffffffff70);
    CopyToFunctionLocalState::InitializeAppendState
              ((CopyToFunctionLocalState *)this_00._M_head_impl,(ClientContext *)in_RDI._M_head_impl
               ,op,gstate);
    unique_ptr<duckdb::LocalSinkState,std::default_delete<duckdb::LocalSinkState>,true>::
    unique_ptr<duckdb::CopyToFunctionLocalState,std::default_delete<std::unique_ptr<duckdb::LocalSinkState,std::default_delete<duckdb::LocalSinkState>>>,void>
              ((unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>
                *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    unique_ptr<duckdb::CopyToFunctionLocalState,_std::default_delete<duckdb::CopyToFunctionLocalState>,_true>
    ::~unique_ptr((unique_ptr<duckdb::CopyToFunctionLocalState,_std::default_delete<duckdb::CopyToFunctionLocalState>,_true>
                   *)0x1866689);
    in_RDI._M_head_impl = this_00._M_head_impl;
  }
  return (unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>)
         (_Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_>)
         in_RDI._M_head_impl;
}

Assistant:

unique_ptr<LocalSinkState> PhysicalCopyToFile::GetLocalSinkState(ExecutionContext &context) const {
	if (partition_output) {
		auto &g = sink_state->Cast<CopyToFunctionGlobalState>();

		auto state = make_uniq<CopyToFunctionLocalState>(nullptr);
		state->InitializeAppendState(context.client, *this, g);
		return std::move(state);
	}
	auto res = make_uniq<CopyToFunctionLocalState>(function.copy_to_initialize_local(context, *bind_data));
	return std::move(res);
}